

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::GetDefiningBlocks(LCSSARewriter *this,uint32_t bb_id)

{
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *this_00;
  DominatorTree *this_01;
  bool bVar1;
  uint32_t a;
  BasicBlock *pBVar2;
  anon_class_8_1_111d19cd __pred;
  size_type sVar3;
  reference ppBVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  reference puVar6;
  const_reference __x;
  iterator __first;
  iterator __last;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pred_blocks;
  const_iterator cStack_68;
  uint32_t pred_id;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3_1;
  BasicBlock *local_48;
  BasicBlock *e_bb;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *defining_blocks;
  LCSSARewriter *pLStack_18;
  uint32_t bb_id_local;
  LCSSARewriter *this_local;
  
  defining_blocks._4_4_ = bb_id;
  pLStack_18 = this;
  pBVar2 = CFG::block(this->cfg_,bb_id);
  if (pBVar2 == (BasicBlock *)0x0) {
    __assert_fail("cfg_->block(bb_id) != nullptr && \"Unknown basic block\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0xdb,
                  "const std::vector<uint32_t> &spvtools::opt::(anonymous namespace)::LCSSARewriter::GetDefiningBlocks(uint32_t)"
                 );
  }
  __pred.defining_blocks =
       std::
       unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::operator[](&this->bb_to_defining_blocks_,(key_type *)((long)&defining_blocks + 4));
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(__pred.defining_blocks);
  if (sVar3 == 0) {
    this_00 = this->exit_bb_;
    __end3 = std::
             unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
             ::begin(this_00);
    e_bb = (BasicBlock *)
           std::
           unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
           ::end(this_00);
    while (bVar1 = std::__detail::operator!=
                             (&__end3.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>,
                              (_Node_iterator_base<spvtools::opt::BasicBlock_*,_false> *)&e_bb),
          bVar1) {
      ppBVar4 = std::__detail::_Node_const_iterator<spvtools::opt::BasicBlock_*,_true,_false>::
                operator*(&__end3);
      local_48 = *ppBVar4;
      this_01 = this->dom_tree_;
      a = BasicBlock::id(local_48);
      bVar1 = DominatorTree::Dominates(this_01,a,defining_blocks._4_4_);
      if (bVar1) {
        __range3_1._4_4_ = BasicBlock::id(local_48);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (__pred.defining_blocks,(value_type_conflict *)((long)&__range3_1 + 4));
        return __pred.defining_blocks;
      }
      std::__detail::_Node_const_iterator<spvtools::opt::BasicBlock_*,_true,_false>::operator++
                (&__end3);
    }
    pvVar5 = CFG::preds(this->cfg_,defining_blocks._4_4_);
    __end3_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar5);
    cStack_68 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=(&__end3_1,&stack0xffffffffffffff98), bVar1) {
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3_1);
      pred_blocks._4_4_ = *puVar6;
      pvVar5 = GetDefiningBlocks(this,pred_blocks._4_4_);
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
      if (sVar3 == 1) {
        __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar5,0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (__pred.defining_blocks,__x);
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (__pred.defining_blocks,(value_type_conflict *)((long)&pred_blocks + 4));
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3_1);
    }
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(__pred.defining_blocks);
    if (sVar3 == 0) {
      __assert_fail("defining_blocks.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                    ,0xf2,
                    "const std::vector<uint32_t> &spvtools::opt::(anonymous namespace)::LCSSARewriter::GetDefiningBlocks(uint32_t)"
                   );
    }
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                        (__pred.defining_blocks);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(__pred.defining_blocks);
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,spvtools::opt::(anonymous_namespace)::LCSSARewriter::GetDefiningBlocks(unsigned_int)::_lambda(unsigned_int)_1_>
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )__first._M_current,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )__last._M_current,__pred);
    if (bVar1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(__pred.defining_blocks,1);
    }
  }
  return __pred.defining_blocks;
}

Assistant:

const std::vector<uint32_t>& GetDefiningBlocks(uint32_t bb_id) {
    assert(cfg_->block(bb_id) != nullptr && "Unknown basic block");
    std::vector<uint32_t>& defining_blocks = bb_to_defining_blocks_[bb_id];

    if (defining_blocks.size()) return defining_blocks;

    // Check if one of the loop exit basic block dominates |bb_id|.
    for (const BasicBlock* e_bb : exit_bb_) {
      if (dom_tree_.Dominates(e_bb->id(), bb_id)) {
        defining_blocks.push_back(e_bb->id());
        return defining_blocks;
      }
    }

    // Process parents, they will returns their suitable blocks.
    // If they are all the same, this means this basic block is dominated by a
    // common block, so we won't need to build a phi instruction.
    for (uint32_t pred_id : cfg_->preds(bb_id)) {
      const std::vector<uint32_t>& pred_blocks = GetDefiningBlocks(pred_id);
      if (pred_blocks.size() == 1)
        defining_blocks.push_back(pred_blocks[0]);
      else
        defining_blocks.push_back(pred_id);
    }
    assert(defining_blocks.size());
    if (std::all_of(defining_blocks.begin(), defining_blocks.end(),
                    [&defining_blocks](uint32_t id) {
                      return id == defining_blocks[0];
                    })) {
      // No need for a phi.
      defining_blocks.resize(1);
    }

    return defining_blocks;
  }